

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

void __thiscall Heap<4U>::Heap_Up(Heap<4U> *this,uint32_t i)

{
  int iVar1;
  mapped_type mVar2;
  Counter *pCVar3;
  Counter CVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  uint uVar7;
  
  while( true ) {
    if (i < 2) {
      return;
    }
    uVar7 = i - 1 >> 1;
    pCVar3 = this->heaps;
    iVar1 = pCVar3[uVar7].counter;
    if (iVar1 <= pCVar3[i].counter) break;
    CVar4 = pCVar3[i];
    *(undefined4 *)pCVar3[i].item.str = *(undefined4 *)pCVar3[uVar7].item.str;
    pCVar3[i].counter = iVar1;
    *&pCVar3[uVar7].item.str = CVar4.item.str.str;
    pCVar3[uVar7].counter = CVar4.counter;
    pmVar5 = std::__detail::
             _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->mp,&this->heaps[i].item);
    pmVar6 = std::__detail::
             _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->mp,&this->heaps[uVar7].item);
    mVar2 = *pmVar5;
    *pmVar5 = *pmVar6;
    *pmVar6 = mVar2;
    i = uVar7;
  }
  return;
}

Assistant:

void Heap_Up(uint32_t i) {
		while (i > 1) {
			uint32_t parent = (i - 1) / 2;
			if (heaps[parent].counter <= heaps[i].counter) {
				break;
			}
			std::swap(heaps[i], heaps[parent]);
			std::swap(mp[heaps[i].item], mp[heaps[parent].item]);
			i = parent;
		}
	}